

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_set.hpp
# Opt level: O2

pair<pstore::index::hamt_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::set_iterator<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<true>_>,_bool>
* __thiscall
pstore::index::
hamt_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>::
insert<std::__cxx11::string,void>
          (pair<pstore::index::hamt_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::set_iterator<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<true>_>,_bool>
           *__return_storage_ptr__,void *this,transaction_base *transaction,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
  uVar1;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  it;
  iterator_base<true> local_308;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_218;
  iterator_base<true> local_120;
  
  std::__cxx11::string::string((string *)&local_308,(string *)key);
  hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::insert<std::__cxx11::string,pstore::index::details::empty_class,void>
            (&local_218,
             (hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)((long)this + 8),transaction,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>
              *)&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::iterator_base<true>::iterator_base<true,void>
            ((iterator_base<true> *)&local_120,&local_218.first);
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<true>::iterator_base(&local_308,&local_120);
  (__return_storage_ptr__->first).it_.db_ = local_308.db_;
  memcpy(&(__return_storage_ptr__->first).it_.visited_parents_,&local_308.visited_parents_,0xd8);
  uVar1._M_t.
  super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_*,_false>
  ._M_head_impl =
       local_308.pos_._M_t.
       super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
       .
       super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_*,_false>
       ._M_head_impl;
  (__return_storage_ptr__->first).it_.index_ = local_308.index_;
  local_308.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>,_true,_true>
        )(__uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
          )0x0;
  (__return_storage_ptr__->first).it_.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_*,_false>
  ._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>
        *)uVar1._M_t.
          super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
          .
          super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_*,_false>
          ._M_head_impl;
  __return_storage_ptr__->second = local_218.second;
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
  ::~unique_ptr(&local_308.pos_);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
  ::~unique_ptr(&local_120.pos_);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>_>_>
  ::~unique_ptr(&local_218.first.pos_);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert (transaction_base & transaction,
                                              OtherKeyType const & key) {
                auto it = map_.insert (transaction, std::make_pair (key, details::empty_class ()));
                return {iterator{it.first}, it.second};
            }